

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

ostream * Catch::operator<<(ostream *os,pluralise *pluraliser)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  uStack_18._0_7_ = CONCAT16(0x20,(undefined6)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_18 + 6),1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(pluraliser->m_label)._M_dataplus._M_p,(pluraliser->m_label)._M_string_length);
  if (pluraliser->m_count != 1) {
    uStack_18 = CONCAT17(0x73,(undefined7)uStack_18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)os,(char *)((long)&uStack_18 + 7),1);
  }
  return os;
}

Assistant:

std::ostream& operator << ( std::ostream& os, pluralise const& pluraliser ) {
        os << pluraliser.m_count << ' ' << pluraliser.m_label;
        if( pluraliser.m_count != 1 )
            os << 's';
        return os;
    }